

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void name_public_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  _func_int **pp_Var2;
  int iVar3;
  Fl_Class_Type *pFVar4;
  bool bVar5;
  Fl_Type *pFVar6;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,(uint)(0 < current_widget->public_));
    pFVar4 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    pp_Var2 = (i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget;
    if (pFVar4 == (Fl_Class_Type *)0x0) {
      (*pp_Var2[5])(i);
      return;
    }
    (*pp_Var2[6])();
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar5 = true;
    pFVar6 = Fl_Type::first;
    do {
      while ((pFVar6->selected != '\0' &&
             (iVar3 = (*pFVar6->_vptr_Fl_Type[0x17])(pFVar6), iVar3 != 0))) {
        pFVar1 = (i->super_Fl_Menu_).value_;
        if (pFVar1 == (Fl_Menu_Item *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) * -0x49249249;
        }
        *(int *)&pFVar6[1].factory = iVar3;
        pFVar6 = pFVar6->next;
        bVar5 = false;
        if (pFVar6 == (Fl_Type *)0x0) goto LAB_00183254;
      }
      pFVar6 = pFVar6->next;
    } while (pFVar6 != (Fl_Type *)0x0);
    if (!bVar5) {
LAB_00183254:
      set_modflag(1);
      redraw_browser();
      return;
    }
  }
  return;
}

Assistant:

void name_public_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_>0);
    if (current_widget->is_in_class()) i->hide(); else i->show();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	((Fl_Widget_Type*)o)->public_ = i->value();
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}